

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryElement.cpp
# Opt level: O0

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::GeometryElement::childElementForName(GeometryElement *this,string *name)

{
  bool bVar1;
  undefined1 uVar2;
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<iDynTree::XMLElement> sVar5;
  shared_ptr<iDynTree::XMLElement> *element;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined1 *puVar6;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  XMLParserState *in_stack_fffffffffffffee8;
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined1 local_50 [55];
  undefined1 local_19;
  
  local_19 = 0;
  iDynTree::XMLElement::getParserState();
  std::make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
            (in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  bVar1 = std::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1baefc);
    std::
    function<bool(std::unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>const&)>
    ::
    function<iDynTree::GeometryElement::childElementForName(std::__cxx11::string_const&)::__0,void>
              (in_stack_fffffffffffffed0,
               (anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    iDynTree::XMLElement::setAttributeCallback(peVar3,local_50);
    std::
    function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
    ::~function((function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                 *)0x1baf49);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bafbe);
      std::
      function<bool(std::unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>const&)>
      ::
      function<iDynTree::GeometryElement::childElementForName(std::__cxx11::string_const&)::__1,void>
                (in_stack_fffffffffffffed0,
                 (anon_class_8_1_8991fb9c *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      iDynTree::XMLElement::setAttributeCallback(peVar3,local_78);
      std::
      function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
      ::~function((function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                   *)0x1bb00b);
      _Var4._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if (bVar1) {
        this_00 = (function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                   *)std::
                     __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1bb067);
        std::
        function<bool(std::unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>const&)>
        ::
        function<iDynTree::GeometryElement::childElementForName(std::__cxx11::string_const&)::__2,void>
                  (this_00,(anon_class_8_1_8991fb9c *)
                           CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        iDynTree::XMLElement::setAttributeCallback(this_00,local_a0);
        std::
        function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
        ::~function((function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                     *)0x1bb0b4);
        _Var4._M_pi = extraout_RDX_01;
      }
      else {
        uVar2 = std::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        _Var4._M_pi = extraout_RDX_02;
        if ((bool)uVar2) {
          peVar3 = std::
                   __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bb10d);
          puVar6 = local_c8;
          std::
          function<bool(std::unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>const&)>
          ::
          function<iDynTree::GeometryElement::childElementForName(std::__cxx11::string_const&)::__3,void>
                    (in_stack_fffffffffffffed0,
                     (anon_class_8_1_8991fb9c *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
          iDynTree::XMLElement::setAttributeCallback(peVar3,puVar6);
          std::
          function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
          ::~function((function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                       *)0x1bb152);
          _Var4._M_pi = extraout_RDX_03;
        }
      }
    }
  }
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> GeometryElement::childElementForName(const std::string& name)
    {
        std::shared_ptr<XMLElement> element = std::make_shared<XMLElement>(
            getParserState(), name);
        if (name == "box") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>> &attributes){

                auto found = attributes.find("size");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::box", "Missing 'size' attribute for box geometry.");
                    return false;
                }
                Vector3 boxDimensionn;
                if (!vector3FromString(found->second->value(), boxDimensionn)) {

                    return false;
                }
                Box *box = new Box();

                box->setX(boxDimensionn(0));
                box->setY(boxDimensionn(1));
                box->setZ(boxDimensionn(2));

                m_shape = std::shared_ptr<SolidShape>(box);
                return true;
            });
        } else if (name == "cylinder") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                double radius, length;
                auto found = attributes.find("radius");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Missing 'radius' attribute for cylinder geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), radius)) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Failed to parse 'radius' attribute for cylinder geometry.");
                    return false;
                }

                found = attributes.find("length");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Missing 'length' attribute for cylinder geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), length)) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Failed to parse 'length' attribute for cylinder geometry.");
                    return false;
                }
                Cylinder * cylinder = new Cylinder();
                cylinder->setRadius(radius);
                cylinder->setLength(length);

                m_shape = std::shared_ptr<Cylinder>(cylinder);
                return true;
            });
        } else if (name == "sphere") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                double radius;
                auto found = attributes.find("radius");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::sphere", "Missing 'radius' attribute for sphere geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), radius)) {
                    reportError("GeometryElement", "childElementForName::sphere", "Failed to parse 'radius' attribute for sphere geometry.");
                    return false;
                }

                Sphere * sphere = new Sphere();
                sphere->setRadius(radius);

                m_shape = std::shared_ptr<Sphere>(sphere);
                return true;
            });
        } else if (name == "mesh") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                auto found = attributes.find("filename");
                if (found == attributes.end()) {
                    reportWarning("GeometryElement", "childElementForName::mesh", "Missing 'filename' attribute for sphere mesh.");
                } else {
                    //TODO: Do not fail (?)
                    // For now we just support urdf with local meshes, see as an example
                    // https://github.com/bulletphysics/bullet3/tree/master/data
                    ExternalMesh * externalMesh = new ExternalMesh();
                    externalMesh->setFilename(found->second->value());
                    externalMesh->setPackageDirs(this->packageDirs);
                    //                    pExternalMesh->filename = getURDFMeshAbsolutePathFilename(urdf_filename,localName);
                    iDynTree::Vector3 scale;
                    scale(0) = scale(1) = scale(2) = 1.0;

                    found = attributes.find("scale");
                    if (found != attributes.end()) {
                        vector3FromString(found->second->value(), scale);
                    }
                    externalMesh->setScale(scale);
                    m_shape = std::shared_ptr<ExternalMesh>(externalMesh);
                }
                return true;
            });
        }
        return element;
    }